

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,StringTree *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,StringTree *params_8,ArrayPtr<const_char> *params_9)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_c0;
  StringTree *local_a8;
  StringTree *local_a0;
  StringTree *local_98;
  StringTree *local_90;
  StringTree *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  size_t sStack_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_80 = (this->text).content.ptr;
  local_78 = params->ptr;
  local_70 = (params_1->text).content.ptr;
  local_68 = params_2->ptr;
  local_60 = (params_3->text).content.ptr;
  local_58 = params_4->ptr;
  local_50 = (params_5->text).content.ptr;
  sStack_48 = params_6->size_;
  local_40 = params_7->ptr;
  local_38 = (params_8->text).content.ptr;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0xa;
  local_a0 = (StringTree *)params;
  local_88 = (StringTree *)params_2;
  sVar1 = _::sum((_ *)&local_80,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_80 = (this->text).content.ptr;
  local_78 = (char *)0x0;
  local_70 = (params_1->text).content.ptr;
  local_68 = (char *)0x0;
  local_60 = (params_3->text).content.ptr;
  local_58 = (char *)0x0;
  local_50 = (params_5->text).content.ptr;
  sStack_48 = params_6->size_;
  local_40 = (char *)0x0;
  local_38 = (params_8->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0xa;
  local_a8 = this;
  local_98 = params_1;
  local_90 = params_3;
  sVar1 = _::sum((_ *)&local_80,nums_00);
  heapString((String *)&local_c0,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_c0);
  Array<char>::~Array((Array<char> *)&local_c0);
  local_80 = (char *)0x0;
  local_78 = (char *)0x1;
  local_70 = (char *)0x0;
  local_68 = (char *)0x1;
  local_60 = (char *)0x0;
  local_58 = (char *)0x1;
  local_50 = (char *)0x0;
  sStack_48 = 0;
  local_40 = (char *)0x1;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0xa;
  sVar1 = _::sum((_ *)&local_80,nums_01);
  local_c0.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_c0.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_c0.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_c0);
  Array<kj::StringTree::Branch>::~Array(&local_c0);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_a8,local_a0,
             (ArrayPtr<const_char> *)local_98,local_88,(ArrayPtr<const_char> *)local_90,
             (StringTree *)params_4,(ArrayPtr<const_char> *)params_5,params_6,(StringTree *)params_7
             ,(ArrayPtr<const_char> *)params_8);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}